

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity.c
# Opt level: O0

void unittest_error(gravity_vm *vm,error_type_t error_type,char *message,error_desc_t error_desc,
                   void *xdata)

{
  bool bVar1;
  bool bVar2;
  _Bool same_col;
  _Bool same_row;
  char *pcStack_48;
  _Bool same_error;
  char *type;
  unittest_data *data;
  void *xdata_local;
  char *message_local;
  error_type_t error_type_local;
  gravity_vm *vm_local;
  error_desc_t error_desc_local;
  
  if ((*xdata & 1) != 1) {
    *(undefined1 *)xdata = 1;
    pcStack_48 = "NONE";
    if (error_type == GRAVITY_ERROR_SYNTAX) {
      pcStack_48 = "SYNTAX";
    }
    else if (error_type == GRAVITY_ERROR_SEMANTIC) {
      pcStack_48 = "SEMANTIC";
    }
    else if (error_type == GRAVITY_ERROR_RUNTIME) {
      pcStack_48 = "RUNTIME";
    }
    else if (error_type == GRAVITY_WARNING) {
      pcStack_48 = "WARNING";
    }
    if (error_type == GRAVITY_ERROR_RUNTIME) {
      printf("\tRUNTIME ERROR: ");
    }
    else {
      printf("\t%s ERROR on %d (%d,%d): ",pcStack_48,error_desc._8_8_ & 0xffffffff,
             error_desc._0_8_ & 0xffffffff,error_desc._0_8_ >> 0x20);
    }
    printf("%s\n",message);
    if (*(int *)((long)xdata + 0x28) == -1) {
      bVar1 = true;
    }
    else {
      vm_local._0_4_ = error_desc.lineno;
      bVar1 = *(uint32_t *)((long)xdata + 0x28) == (uint32_t)vm_local;
    }
    if (*(int *)((long)xdata + 0x2c) == -1) {
      bVar2 = true;
    }
    else {
      vm_local._4_4_ = error_desc.colno;
      bVar2 = *(uint32_t *)((long)xdata + 0x2c) == vm_local._4_4_;
    }
    if ((*(byte *)((long)xdata + 1) & 1) == 0) {
      if (((*(error_type_t *)((long)xdata + 0x10) == error_type) && (bVar1)) && (bVar2)) {
        *(int *)((long)xdata + 8) = *(int *)((long)xdata + 8) + 1;
        printf("\tSUCCESS\n");
      }
      else {
        *(int *)((long)xdata + 0xc) = *(int *)((long)xdata + 0xc) + 1;
        printf("\tFAILURE\n");
      }
    }
    else {
      *(int *)((long)xdata + 8) = *(int *)((long)xdata + 8) + 1;
      printf("\tSUCCESS\n");
    }
  }
  return;
}

Assistant:

static void unittest_error (gravity_vm *vm, error_type_t error_type, const char *message, error_desc_t error_desc, void *xdata) {
    (void) vm;
    
    unittest_data *data = (unittest_data *)xdata;
    if (data->processed == true) return; // ignore 2nd error
    data->processed = true;
    
    const char *type = "NONE";
    if (error_type == GRAVITY_ERROR_SYNTAX) type = "SYNTAX";
    else if (error_type == GRAVITY_ERROR_SEMANTIC) type = "SEMANTIC";
    else if (error_type == GRAVITY_ERROR_RUNTIME) type = "RUNTIME";
    else if (error_type == GRAVITY_WARNING) type = "WARNING";
    
    if (error_type == GRAVITY_ERROR_RUNTIME) printf("\tRUNTIME ERROR: ");
    else printf("\t%s ERROR on %d (%d,%d): ", type, error_desc.fileid, error_desc.lineno, error_desc.colno);
    printf("%s\n", message);
    
    bool same_error = (data->expected_error == error_type);
    bool same_row = (data->expected_row != -1) ? (data->expected_row == error_desc.lineno) : true;
    bool same_col = (data->expected_col != -1) ? (data->expected_col == error_desc.colno) : true;
    
    if (data->is_fuzzy) {
        ++data->nsuccess;
        printf("\tSUCCESS\n");
        return;
    }
    
    if (same_error && same_row && same_col) {
        ++data->nsuccess;
        printf("\tSUCCESS\n");
    } else {
        ++data->nfailure;
        printf("\tFAILURE\n");
    }
}